

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshot.cpp
# Opt level: O1

void __thiscall
TTD::SnapShot::ReLinkThreadContextInfo
          (SnapShot *this,InflateMap *inflator,ThreadContextTTD *intoCtx)

{
  TTDSetActiveJsRTContext UNRECOVERED_JUMPTABLE;
  RecyclableObject *obj;
  ScriptContext *pSVar1;
  void *pvVar2;
  SnapRootInfoEntry *pSVar3;
  SnapRootInfoEntry *rootEntry;
  SnapRootInfoEntry *pSVar4;
  UnorderedArrayListLink *pUVar5;
  
  pSVar3 = (this->m_rootList).m_inlineHeadBlock.CurrPos;
  pSVar4 = (this->m_rootList).m_inlineHeadBlock.BlockData;
  if (pSVar4 != (SnapRootInfoEntry *)0x0 && pSVar4 != pSVar3) {
    pUVar5 = (this->m_rootList).m_inlineHeadBlock.Next;
    do {
      obj = InflateMap::LookupObject(inflator,pSVar4->LogObject);
      ThreadContextTTD::ForceSetRootInfoInRestore
                (intoCtx,pSVar4->LogId,obj,pSVar4->MaybeLongLivedRoot);
      pSVar4 = pSVar4 + 1;
      if (pSVar4 == pSVar3) {
        if (pUVar5 == (UnorderedArrayListLink *)0x0) {
          pSVar4 = (SnapRootInfoEntry *)0x0;
        }
        else {
          pSVar3 = pUVar5->CurrPos;
          pSVar4 = pUVar5->BlockData;
          pUVar5 = pUVar5->Next;
        }
      }
    } while (pSVar4 != (SnapRootInfoEntry *)0x0);
  }
  if (this->m_activeScriptContext == 0) {
    pSVar1 = (ScriptContext *)0x0;
  }
  else {
    pSVar1 = InflateMap::LookupScriptContext(inflator,this->m_activeScriptContext);
  }
  UNRECOVERED_JUMPTABLE = (intoCtx->TTDExternalObjectFunctions).pfSetActiveJsRTContext;
  pvVar2 = ThreadContextTTD::GetRuntimeHandle(intoCtx);
  (*UNRECOVERED_JUMPTABLE)(pvVar2,pSVar1);
  return;
}

Assistant:

void SnapShot::ReLinkThreadContextInfo(InflateMap* inflator, ThreadContextTTD* intoCtx) const
    {
        for(auto iter = this->m_rootList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            const NSSnapValues::SnapRootInfoEntry* rootEntry = iter.Current();
            Js::RecyclableObject* rootObj = inflator->LookupObject(rootEntry->LogObject);

            intoCtx->ForceSetRootInfoInRestore(rootEntry->LogId, rootObj, rootEntry->MaybeLongLivedRoot);
        }

        if(this->m_activeScriptContext == TTD_INVALID_LOG_PTR_ID)
        {
            intoCtx->TTDExternalObjectFunctions.pfSetActiveJsRTContext(intoCtx->GetRuntimeHandle(), nullptr);
        }
        else
        {
            Js::ScriptContext* ctx = inflator->LookupScriptContext(this->m_activeScriptContext);
            intoCtx->TTDExternalObjectFunctions.pfSetActiveJsRTContext(intoCtx->GetRuntimeHandle(), ctx);
        }
    }